

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

bool __thiscall
MADPComponentDiscreteStates::SetInitialized(MADPComponentDiscreteStates *this,bool b)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  reference pdVar5;
  ostream *this_00;
  size_type sVar6;
  byte in_SIL;
  int __x;
  long in_RDI;
  double dVar7;
  const_iterator it;
  double sum;
  bool validISD;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char *pcVar8;
  char *arg;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar9;
  undefined4 in_stack_ffffffffffffffe4;
  
  bVar1 = (bool)(in_SIL & 1);
  if (bVar1 != false) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      uVar4 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8);
      __cxa_throw(uVar4,&E::typeinfo,E::~E);
    }
    uVar9 = CONCAT13(1,(int3)in_stack_ffffffffffffffe0);
    pcVar8 = (char *)0x0;
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffa8);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              (in_stack_ffffffffffffffb0,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffffa8);
    while( true ) {
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffa8);
      __x = (int)&stack0xffffffffffffffd0;
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffb0,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar2) break;
      pdVar5 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&stack0xffffffffffffffd0);
      if (*pdVar5 < 0.0) {
        uVar9 = uVar9 & 0xffffff;
      }
      pdVar5 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&stack0xffffffffffffffd0);
      if (1.0 < *pdVar5) {
        uVar9 = uVar9 & 0xffffff;
      }
      pdVar5 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&stack0xffffffffffffffd0);
      uVar3 = std::isnan(*pdVar5);
      if ((uVar3 & 1) != 0) {
        uVar9 = uVar9 & 0xffffff;
      }
      pdVar5 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&stack0xffffffffffffffd0);
      pcVar8 = (char *)(*pdVar5 + (double)pcVar8);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *
                 )&stack0xffffffffffffffd0);
    }
    dVar7 = (double)pcVar8 - 1.0;
    std::abs(__x);
    if (1e-12 < dVar7) {
      uVar9 = uVar9 & 0xffffff;
    }
    arg = pcVar8;
    std::abs(__x);
    if ((double)pcVar8 < 1e-12) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "Warning, initial state distribution was not set, assuming uniform..."
                               );
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      SetUniformISD((MADPComponentDiscreteStates *)in_stack_ffffffffffffffd0._M_current);
      uVar9 = CONCAT13(1,(int3)uVar9);
    }
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x30) + 8));
    if (sVar6 != *(size_type *)(in_RDI + 0x10)) {
      uVar9 = uVar9 & 0xffffff;
    }
    if ((uVar9 & 0x1000000) == 0) {
      uVar4 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT44(in_stack_ffffffffffffffe4,uVar9),arg);
      __cxa_throw(uVar4,&E::typeinfo,E::~E);
    }
  }
  *(bool *)(in_RDI + 8) = bVar1;
  return bVar1;
}

Assistant:

bool MADPComponentDiscreteStates::SetInitialized(bool b)
{
    if(b)
    {
        if(_m_nrStates==0)
            throw(E("MADPComponentDiscreteStates::SetInitialized problem has 0 states"));

        // alike to Belief::SanityCheck()

        bool validISD=true;

        // check for negative and entries>1
        double sum=0;
        for(vector<double>::const_iterator it=
                _m_initialStateDistribution->begin();
            it!=_m_initialStateDistribution->end(); ++it)
        {
            if(*it<0)
                validISD=false;
            if(*it>1)
                validISD=false;
            if(std::isnan(*it))
                validISD=false;
            sum+=*it;
        }

        // check if sums to 1
        if(abs(sum-1)>PROB_PRECISION)
            validISD=false;

        // but if it sums to 0, this means the ISD simply has not been set.
        // in this case, we set to uniform:
        if(abs(sum) < PROB_PRECISION)
        {
            cerr << "Warning, initial state distribution was not set, assuming uniform..." << endl;
            this->SetUniformISD();
            validISD = true;
        }

        // check whether the size is correct
        if(_m_initialStateDistribution->size()!=_m_nrStates)
            validISD=false;
        
        if(!validISD)
            throw(E("MADPComponentDiscreteStates::SetInitialized initial state distribution is not a valid probability distribution"));
    }

    _m_initialized = b;
    return(b);
}